

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQInteger __thiscall SQFuncState::PushTarget(SQFuncState *this,SQInteger n)

{
  SQIntVec *pSVar1;
  SQUnsignedInteger *pSVar2;
  ulong uVar3;
  ulong uVar4;
  SQUnsignedInteger SVar5;
  longlong *plVar6;
  SQUnsignedInteger SVar7;
  
  if (n == -1) {
    n = AllocStackPos(this);
  }
  pSVar1 = &this->_targetstack;
  uVar3 = (this->_targetstack)._size;
  uVar4 = (this->_targetstack)._allocated;
  pSVar2 = &(this->_targetstack)._size;
  if (uVar4 <= uVar3) {
    SVar5 = uVar3 * 2;
    SVar7 = 4;
    if (SVar5 != 0) {
      SVar7 = SVar5;
    }
    plVar6 = (longlong *)sq_vm_realloc(pSVar1->_vals,uVar4 << 3,SVar7 * 8);
    pSVar1->_vals = plVar6;
    (this->_targetstack)._allocated = SVar7;
  }
  SVar5 = *pSVar2;
  *pSVar2 = SVar5 + 1;
  pSVar1->_vals[SVar5] = n;
  return n;
}

Assistant:

SQInteger SQFuncState::PushTarget(SQInteger n)
{
    if(n!=-1){
        _targetstack.push_back(n);
        return n;
    }
    n=AllocStackPos();
    _targetstack.push_back(n);
    return n;
}